

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_20f12f9::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericResponseSentHandler *handler)

{
  pair<std::__detail::_Node_iterator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false,_false>,_bool>
  pVar1;
  unique_lock<std::mutex> lock;
  TypeInfo *local_50;
  unique_lock<std::mutex> local_48;
  undefined8 local_38 [4];
  
  local_50 = typeinfo;
  std::unique_lock<std::mutex>::unique_lock(&local_48,&(this->handlers).responseSentMutex);
  pVar1 = std::
          _Hashtable<dap::TypeInfo_const*,std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>,std::__detail::_Select1st,std::equal_to<dap::TypeInfo_const*>,std::hash<dap::TypeInfo_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<dap::TypeInfo_const*&,std::function<void(void_const*,dap::Error_const*)>const&>
                    ((_Hashtable<dap::TypeInfo_const*,std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>,std::__detail::_Select1st,std::equal_to<dap::TypeInfo_const*>,std::hash<dap::TypeInfo_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&(this->handlers).responseSentMap,&local_50,handler);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (*local_50->_vptr_TypeInfo[2])(local_38);
    EventHandlers::errorfLocked
              (&this->handlers,"Response sent handler for \'%s\' already registered",local_38[0]);
    std::__cxx11::string::~string((string *)local_38);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericResponseSentHandler& handler) override {
    handlers.put(typeinfo, handler);
  }